

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamIOException.hpp
# Opt level: O2

void __thiscall antlr::TokenStreamIOException::~TokenStreamIOException(TokenStreamIOException *this)

{
  ~TokenStreamIOException(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~TokenStreamIOException() throw()
	{
	}